

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

double __thiscall chrono::fea::ChElementTetraCorot_10::ComputeVolume(ChElementTetraCorot_10 *this)

{
  double dVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  Scalar SVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_e0;
  ChMatrixDynamic<> M;
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_88 [16];
  double local_78;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> local_70;
  undefined1 local_38 [16];
  double local_28;
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar5 = *(undefined1 (*) [16])((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_38 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar4->super_ChNodeFEAbase + 0x20),auVar5);
  local_98 = *(double *)&peVar3->field_0x30;
  local_28 = *(double *)&peVar4->field_0x30 - local_98;
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_88 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar3->super_ChNodeFEAbase + 0x20),auVar5);
  local_78 = *(double *)&peVar3->field_0x30 - local_98;
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_a8 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar3->super_ChNodeFEAbase + 0x20),auVar5);
  local_98 = *(double *)&peVar3->field_0x30 - local_98;
  local_70.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_0>.m_data.
  _0_4_ = 3;
  local_e0._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&M,(int *)&local_70,(int *)&local_e0);
  local_e0._0_8_ = local_38;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
            (&local_70,(Matrix<double,__1,__1,_1,__1,__1> *)&M,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_70,&local_e0);
  local_e0._0_8_ = local_88;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block(&local_70,&M,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_70,&local_e0);
  local_e0._0_8_ = local_a8;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block(&local_70,&M,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_70,&local_e0);
  Eigen::internal::
  inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run(&M);
  SVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&M);
  auVar7._0_8_ = SVar6 / 6.0;
  auVar7._8_8_ = extraout_XMM0_Qb;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar5 = vandpd_avx512vl(auVar7,auVar5);
  dVar1 = (double)vmovlpd_avx(auVar5);
  this->Volume = dVar1;
  Eigen::internal::handmade_aligned_free
            (M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  local_b8 = auVar5._0_8_;
  return local_b8;
}

Assistant:

double ChElementTetraCorot_10::ComputeVolume() {
    ChVector<> B1, C1, D1;
    B1.Sub(nodes[1]->pos, nodes[0]->pos);
    C1.Sub(nodes[2]->pos, nodes[0]->pos);
    D1.Sub(nodes[3]->pos, nodes[0]->pos);
    ChMatrixDynamic<> M(3, 3);
    M.col(0) = B1.eigen();
    M.col(1) = C1.eigen();
    M.col(2) = D1.eigen();
    M.transposeInPlace();
    Volume = std::abs(M.determinant() / 6);
    return Volume;
}